

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall cs_impl::any::make<cs::structure,cs::structure_const*>(any *this,structure **args)

{
  proxy *ppVar1;
  int local_1c;
  holder<cs::structure> *local_18;
  
  local_1c = 1;
  local_18 = cs::
             allocator_type<cs_impl::any::holder<cs::structure>,64ul,cs_impl::default_allocator_provider>
             ::alloc<cs::structure_const*>
                       ((allocator_type<cs_impl::any::holder<cs::structure>,64ul,cs_impl::default_allocator_provider>
                         *)holder<cs::structure>::allocator,args);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<cs::structure>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_1c,&local_18);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}